

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O1

void __thiscall
FOptionMenuScreenResolutionLine::FOptionMenuScreenResolutionLine
          (FOptionMenuScreenResolutionLine *this,char *action)

{
  long lVar1;
  FName local_14;
  
  lVar1 = 0;
  FName::NameManager::FindName(&FName::NameData,action,false);
  FOptionMenuItem::FOptionMenuItem(&this->super_FOptionMenuItem,(char *)"",&local_14,false);
  (this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FOptionMenuScreenResolutionLine_006f21b0;
  do {
    *(undefined8 *)((long)&this->mResTexts[0].Chars + lVar1) = 0x727dbc;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  FString::NullString.RefCount = FString::NullString.RefCount + 3;
  this->mSelection = 0;
  this->mHighlight = -1;
  return;
}

Assistant:

FOptionMenuScreenResolutionLine(const char *action)
		: FOptionMenuItem("", action)
	{
		mSelection = 0;
		mHighlight = -1;
	}